

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall ParserProbModelXML::InitializeLRFs(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  FactoredDecPOMDPDiscrete *this_00;
  int iVar2;
  xmlXPathObjectPtr pxVar3;
  mapped_type *pmVar4;
  EParse *this_01;
  long lVar5;
  char *this_02;
  string name;
  ParserInterface local_50;
  xmlDocPtr local_40;
  
  this_02 = "/ProbModelXML/ProbNet/Variables/Variable[@role=\'utility\']";
  pxVar3 = GetNodesMatchingExpression
                     (this,(xmlChar *)"/ProbModelXML/ProbNet/Variables/Variable[@role=\'utility\']",
                      (xmlNodePtr)0x0);
  if (pxVar3 == (xmlXPathObjectPtr)0x0) {
    this_01 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(this_01,"No reward variables found in the model.");
    __cxa_throw(this_01,&EParse::typeinfo,E::~E);
  }
  pxVar1 = pxVar3->nodesetval;
  iVar2 = pxVar1->nodeNr;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      GetVariableName_abi_cxx11_
                ((string *)&stack0xffffffffffffffb0,(ParserProbModelXML *)this_02,
                 pxVar1->nodeTab[lVar5]);
      this_02 = (char *)&stack0xffffffffffffffb0;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
               ::operator[](&this->_m_parsedElements,(key_type *)&stack0xffffffffffffffb0);
      pmVar4->first = REWARD;
      pmVar4->second = (uint)lVar5;
      if ((xmlDocPtr *)local_50._vptr_ParserInterface != &stack0xffffffffffffffc0) {
        this_02 = (char *)(local_40 + 1);
        operator_delete(local_50._vptr_ParserInterface,(ulong)this_02);
      }
      lVar5 = lVar5 + 1;
      iVar2 = pxVar1->nodeNr;
    } while (lVar5 < iVar2);
  }
  this_00 = this->_m_fDecPOMDP;
  this_00->_m_nrLRFs = (long)iVar2;
  FactoredDecPOMDPDiscrete::InitializeStorage(this_00);
  xmlXPathFreeObject(pxVar3);
  return;
}

Assistant:

void ParserProbModelXML::InitializeLRFs()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@role='utility']";
    xmlXPathObjectPtr reward_nodes = GetNodesMatchingExpression(xpath);

    if(reward_nodes == NULL){
        throw EParse("No reward variables found in the model.");
    }

    xmlNodeSetPtr reward_nodeset = reward_nodes->nodesetval;
    for(int i = 0; i < reward_nodeset->nodeNr; i++)
    {
        string name = GetVariableName(reward_nodeset->nodeTab[i]);
        pair<elm_type, Index> element = make_pair(REWARD, i);
        _m_parsedElements[name] = element;
    }

    _m_fDecPOMDP->SetNrLRFs(reward_nodeset->nodeNr);

    xmlXPathFreeObject (reward_nodes);
}